

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImproveCacheLocality.cpp
# Opt level: O1

void __thiscall
Assimp::ImproveCacheLocalityProcess::Execute(ImproveCacheLocalityProcess *this,aiScene *pScene)

{
  bool bVar1;
  Logger *pLVar2;
  uint uVar3;
  ulong uVar4;
  ai_real aVar5;
  float local_1c4;
  long *local_1c0;
  long local_1b0 [2];
  undefined1 local_1a0 [376];
  
  uVar3 = pScene->mNumMeshes;
  pLVar2 = DefaultLogger::get();
  if (uVar3 == 0) {
    Logger::debug(pLVar2,"ImproveCacheLocalityProcess skipped; there are no meshes");
    return;
  }
  Logger::debug(pLVar2,"ImproveCacheLocalityProcess begin");
  if (pScene->mNumMeshes == 0) {
    local_1c4 = 0.0;
    uVar3 = 0;
  }
  else {
    uVar4 = 0;
    local_1c4 = 0.0;
    uVar3 = 0;
    do {
      aVar5 = ProcessMesh(this,pScene->mMeshes[uVar4],(uint)uVar4);
      if ((aVar5 != 0.0) || (NAN(aVar5))) {
        uVar3 = uVar3 + pScene->mMeshes[uVar4]->mNumFaces;
        local_1c4 = local_1c4 + aVar5;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < pScene->mNumMeshes);
  }
  bVar1 = DefaultLogger::isNullLogger();
  if (!bVar1) {
    if (uVar3 != 0) {
      pLVar2 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[20]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                 (char (*) [20])"Cache relevant are ");
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," meshes (",9);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0," faces). Average output ACMR is ",0x20);
      std::ostream::_M_insert<double>((double)(local_1c4 / (float)uVar3));
      std::__cxx11::stringbuf::str();
      Logger::info(pLVar2,(char *)local_1c0);
      if (local_1c0 != local_1b0) {
        operator_delete(local_1c0,local_1b0[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
    }
    pLVar2 = DefaultLogger::get();
    Logger::debug(pLVar2,"ImproveCacheLocalityProcess finished. ");
  }
  return;
}

Assistant:

void ImproveCacheLocalityProcess::Execute( aiScene* pScene) {
    if (!pScene->mNumMeshes) {
        ASSIMP_LOG_DEBUG("ImproveCacheLocalityProcess skipped; there are no meshes");
        return;
    }

    ASSIMP_LOG_DEBUG("ImproveCacheLocalityProcess begin");

    float out = 0.f;
    unsigned int numf = 0, numm = 0;
    for( unsigned int a = 0; a < pScene->mNumMeshes; ++a ){
        const float res = ProcessMesh( pScene->mMeshes[a],a);
        if (res) {
            numf += pScene->mMeshes[a]->mNumFaces;
            out  += res;
            ++numm;
        }
    }
    if (!DefaultLogger::isNullLogger()) {
        if (numf > 0) {
            ASSIMP_LOG_INFO_F("Cache relevant are ", numm, " meshes (", numf, " faces). Average output ACMR is ", out / numf);
        }
        ASSIMP_LOG_DEBUG("ImproveCacheLocalityProcess finished. ");
    }
}